

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QKmsPlane>::emplace<QKmsPlane_const&>
          (QGenericArrayOps<QKmsPlane> *this,qsizetype i,QKmsPlane *args)

{
  QKmsPlane **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  QKmsPlane *pQVar4;
  Data *pDVar5;
  uint *puVar6;
  qsizetype qVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  int *piVar22;
  Type TVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint32_t uVar26;
  uint32_t uVar27;
  uint32_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  uint32_t uVar32;
  uint32_t uVar33;
  uint32_t uVar34;
  Rotations RVar35;
  Rotations RVar36;
  uint32_t uVar37;
  uint32_t uVar38;
  long in_FS_OFFSET;
  bool bVar39;
  Inserter local_e0;
  QKmsPlane local_90;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QArrayDataPointer<QKmsPlane>).d;
  if ((pDVar3 == (Data *)0x0) ||
     (1 < (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_0011e221:
    local_90._12_4_ = 0xaaaaaaaa;
    local_90.id = args->id;
    local_90.type = args->type;
    local_90.possibleCrtcs = args->possibleCrtcs;
    pDVar5 = (args->supportedFormats).d.d;
    local_90.supportedFormats.d.d._0_4_ = SUB84(pDVar5,0);
    local_90.supportedFormats.d.d._4_4_ = (undefined4)((ulong)pDVar5 >> 0x20);
    puVar6 = (args->supportedFormats).d.ptr;
    local_90.supportedFormats.d.ptr._0_4_ = SUB84(puVar6,0);
    local_90.supportedFormats.d.ptr._4_4_ = (undefined4)((ulong)puVar6 >> 0x20);
    qVar7 = (args->supportedFormats).d.size;
    local_90.supportedFormats.d.size._0_4_ = (undefined4)qVar7;
    local_90.supportedFormats.d.size._4_4_ = (undefined4)((ulong)qVar7 >> 0x20);
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    uVar8 = args->initialRotation;
    uVar9 = args->availableRotations;
    uVar10 = args->rotationPropertyId;
    uVar11 = args->crtcPropertyId;
    uVar12 = args->framebufferPropertyId;
    uVar13 = args->srcXPropertyId;
    uVar14 = args->srcYPropertyId;
    uVar15 = args->crtcXPropertyId;
    uVar16 = args->crtcYPropertyId;
    uVar17 = args->srcwidthPropertyId;
    uVar18 = args->srcheightPropertyId;
    uVar19 = args->crtcwidthPropertyId;
    uVar20 = args->crtcheightPropertyId;
    uVar21 = args->zposPropertyId;
    local_90.blendOpPropertyId = args->blendOpPropertyId;
    local_90.activeCrtcId = args->activeCrtcId;
    bVar39 = (this->super_QArrayDataPointer<QKmsPlane>).size != 0;
    local_90.initialRotation.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
    super_QFlagsStorage<QKmsPlane::Rotation>.i =
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)uVar8;
    local_90.availableRotations.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
    super_QFlagsStorage<QKmsPlane::Rotation>.i =
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)uVar9;
    local_90.rotationPropertyId = uVar10;
    local_90.crtcPropertyId = uVar11;
    local_90.framebufferPropertyId = uVar12;
    local_90.srcXPropertyId = uVar13;
    local_90.srcYPropertyId = uVar14;
    local_90.crtcXPropertyId = uVar15;
    local_90.crtcYPropertyId = uVar16;
    local_90.srcwidthPropertyId = uVar17;
    local_90.srcheightPropertyId = uVar18;
    local_90.crtcwidthPropertyId = uVar19;
    local_90.crtcheightPropertyId = uVar20;
    local_90.zposPropertyId = uVar21;
    QArrayDataPointer<QKmsPlane>::detachAndGrow
              (&this->super_QArrayDataPointer<QKmsPlane>,(uint)(i == 0 && bVar39),1,
               (QKmsPlane **)0x0,(QArrayDataPointer<QKmsPlane> *)0x0);
    if (i != 0 || !bVar39) {
      local_e0.sourceCopyConstruct = 0;
      local_e0.nSource = 0;
      local_e0.move = 0;
      local_e0.sourceCopyAssign = 0;
      local_e0.end = (QKmsPlane *)0x0;
      local_e0.last = (QKmsPlane *)0x0;
      local_e0.where = (QKmsPlane *)0x0;
      local_e0.begin = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
      local_e0.size = (this->super_QArrayDataPointer<QKmsPlane>).size;
      local_e0.data = &this->super_QArrayDataPointer<QKmsPlane>;
      Inserter::insertOne(&local_e0,i,&local_90);
      (local_e0.data)->ptr = local_e0.begin;
      (local_e0.data)->size = local_e0.size;
      piVar22 = (int *)CONCAT44(local_90.supportedFormats.d.d._4_4_,
                                local_90.supportedFormats.d.d._0_4_);
      if (piVar22 != (int *)0x0) {
        LOCK();
        *piVar22 = *piVar22 + -1;
        UNLOCK();
        if (*piVar22 == 0) {
          QArrayData::deallocate
                    ((QArrayData *)
                     CONCAT44(local_90.supportedFormats.d.d._4_4_,
                              local_90.supportedFormats.d.d._0_4_),4,0x10);
        }
      }
      goto LAB_0011e3b7;
    }
    pQVar4 = (this->super_QArrayDataPointer<QKmsPlane>).ptr;
    pQVar4[-1].possibleCrtcs = local_90.possibleCrtcs;
    pQVar4[-1].id = local_90.id;
    pQVar4[-1].type = local_90.type;
    pQVar4[-1].supportedFormats.d.d =
         (Data *)CONCAT44(local_90.supportedFormats.d.d._4_4_,local_90.supportedFormats.d.d._0_4_);
    pQVar4[-1].supportedFormats.d.ptr =
         (uint *)CONCAT44(local_90.supportedFormats.d.ptr._4_4_,
                          local_90.supportedFormats.d.ptr._0_4_);
    pQVar4[-1].supportedFormats.d.size =
         CONCAT44(local_90.supportedFormats.d.size._4_4_,
                  (undefined4)local_90.supportedFormats.d.size);
    pQVar4[-1].initialRotation =
         (Rotations)
         local_90.initialRotation.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
         super_QFlagsStorage<QKmsPlane::Rotation>.i;
    pQVar4[-1].availableRotations =
         (Rotations)
         local_90.availableRotations.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
         super_QFlagsStorage<QKmsPlane::Rotation>.i;
    pQVar4[-1].rotationPropertyId = local_90.rotationPropertyId;
    pQVar4[-1].crtcPropertyId = local_90.crtcPropertyId;
    pQVar4[-1].framebufferPropertyId = local_90.framebufferPropertyId;
    pQVar4[-1].srcXPropertyId = local_90.srcXPropertyId;
    pQVar4[-1].srcYPropertyId = local_90.srcYPropertyId;
    pQVar4[-1].crtcXPropertyId = local_90.crtcXPropertyId;
    pQVar4[-1].crtcYPropertyId = local_90.crtcYPropertyId;
    pQVar4[-1].srcwidthPropertyId = local_90.srcwidthPropertyId;
    pQVar4[-1].srcheightPropertyId = local_90.srcheightPropertyId;
    pQVar4[-1].crtcwidthPropertyId = local_90.crtcwidthPropertyId;
    pQVar4[-1].crtcheightPropertyId = local_90.crtcheightPropertyId;
    pQVar4[-1].zposPropertyId = local_90.zposPropertyId;
    pQVar4[-1].blendOpPropertyId = local_90.blendOpPropertyId;
    pQVar4[-1].activeCrtcId = local_90.activeCrtcId;
LAB_0011e332:
    ppQVar1 = &(this->super_QArrayDataPointer<QKmsPlane>).ptr;
    *ppQVar1 = *ppQVar1 + -1;
  }
  else {
    if (((this->super_QArrayDataPointer<QKmsPlane>).size != i) ||
       (pQVar4 = (this->super_QArrayDataPointer<QKmsPlane>).ptr,
       (pDVar3->super_QArrayData).alloc - i ==
       ((long)((long)pQVar4 -
              ((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
       0x4ec4ec4ec4ec4ec5)) {
      if ((i != 0) ||
         (pQVar4 = (this->super_QArrayDataPointer<QKmsPlane>).ptr,
         (QKmsPlane *)((ulong)((long)&pDVar3[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
         == pQVar4)) goto LAB_0011e221;
      pQVar4[-1].possibleCrtcs = args->possibleCrtcs;
      TVar23 = args->type;
      pQVar4[-1].id = args->id;
      pQVar4[-1].type = TVar23;
      pDVar5 = (args->supportedFormats).d.d;
      pQVar4[-1].supportedFormats.d.d = pDVar5;
      pQVar4[-1].supportedFormats.d.ptr = (args->supportedFormats).d.ptr;
      pQVar4[-1].supportedFormats.d.size = (args->supportedFormats).d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      RVar35.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (args->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
      super_QFlagsStorage<QKmsPlane::Rotation>.i =
           (args->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
      uVar37 = args->rotationPropertyId;
      uVar38 = args->crtcPropertyId;
      uVar31 = args->framebufferPropertyId;
      uVar32 = args->srcXPropertyId;
      uVar33 = args->srcYPropertyId;
      uVar34 = args->crtcXPropertyId;
      uVar27 = args->crtcYPropertyId;
      uVar28 = args->srcwidthPropertyId;
      uVar29 = args->srcheightPropertyId;
      uVar30 = args->crtcwidthPropertyId;
      uVar24 = args->zposPropertyId;
      uVar25 = args->blendOpPropertyId;
      uVar26 = args->activeCrtcId;
      pQVar4[-1].crtcheightPropertyId = args->crtcheightPropertyId;
      pQVar4[-1].zposPropertyId = uVar24;
      pQVar4[-1].blendOpPropertyId = uVar25;
      pQVar4[-1].activeCrtcId = uVar26;
      pQVar4[-1].crtcYPropertyId = uVar27;
      pQVar4[-1].srcwidthPropertyId = uVar28;
      pQVar4[-1].srcheightPropertyId = uVar29;
      pQVar4[-1].crtcwidthPropertyId = uVar30;
      pQVar4[-1].framebufferPropertyId = uVar31;
      pQVar4[-1].srcXPropertyId = uVar32;
      pQVar4[-1].srcYPropertyId = uVar33;
      pQVar4[-1].crtcXPropertyId = uVar34;
      pQVar4[-1].initialRotation =
           (Rotations)
           RVar35.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar4[-1].availableRotations =
           (Rotations)
           RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
           super_QFlagsStorage<QKmsPlane::Rotation>.i;
      pQVar4[-1].rotationPropertyId = uVar37;
      pQVar4[-1].crtcPropertyId = uVar38;
      goto LAB_0011e332;
    }
    pQVar4[i].possibleCrtcs = args->possibleCrtcs;
    TVar23 = args->type;
    pQVar4[i].id = args->id;
    pQVar4[i].type = TVar23;
    pDVar5 = (args->supportedFormats).d.d;
    pQVar4[i].supportedFormats.d.d = pDVar5;
    pQVar4[i].supportedFormats.d.ptr = (args->supportedFormats).d.ptr;
    pQVar4[i].supportedFormats.d.size = (args->supportedFormats).d.size;
    if (pDVar5 != (Data *)0x0) {
      LOCK();
      (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    RVar35.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
    super_QFlagsStorage<QKmsPlane::Rotation>.i =
         (args->initialRotation).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
    super_QFlagsStorage<QKmsPlane::Rotation>.i =
         (args->availableRotations).super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    uVar37 = args->rotationPropertyId;
    uVar38 = args->crtcPropertyId;
    uVar31 = args->framebufferPropertyId;
    uVar32 = args->srcXPropertyId;
    uVar33 = args->srcYPropertyId;
    uVar34 = args->crtcXPropertyId;
    uVar27 = args->crtcYPropertyId;
    uVar28 = args->srcwidthPropertyId;
    uVar29 = args->srcheightPropertyId;
    uVar30 = args->crtcwidthPropertyId;
    uVar24 = args->zposPropertyId;
    uVar25 = args->blendOpPropertyId;
    uVar26 = args->activeCrtcId;
    pQVar4[i].crtcheightPropertyId = args->crtcheightPropertyId;
    pQVar4[i].zposPropertyId = uVar24;
    pQVar4[i].blendOpPropertyId = uVar25;
    pQVar4[i].activeCrtcId = uVar26;
    pQVar4[i].crtcYPropertyId = uVar27;
    pQVar4[i].srcwidthPropertyId = uVar28;
    pQVar4[i].srcheightPropertyId = uVar29;
    pQVar4[i].crtcwidthPropertyId = uVar30;
    pQVar4[i].framebufferPropertyId = uVar31;
    pQVar4[i].srcXPropertyId = uVar32;
    pQVar4[i].srcYPropertyId = uVar33;
    pQVar4[i].crtcXPropertyId = uVar34;
    pQVar4[i].initialRotation =
         (Rotations)
         RVar35.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
         super_QFlagsStorage<QKmsPlane::Rotation>.i;
    pQVar4[i].availableRotations =
         (Rotations)
         RVar36.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
         super_QFlagsStorage<QKmsPlane::Rotation>.i;
    pQVar4[i].rotationPropertyId = uVar37;
    pQVar4[i].crtcPropertyId = uVar38;
  }
  pqVar2 = &(this->super_QArrayDataPointer<QKmsPlane>).size;
  *pqVar2 = *pqVar2 + 1;
LAB_0011e3b7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }